

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentNormalizer.cc
# Opt level: O3

void __thiscall ContentNormalizer::handleToken(ContentNormalizer *this,Token *token)

{
  token_type_e tVar1;
  ulong uVar2;
  long lVar3;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  char cVar4;
  ulong uVar5;
  string *psVar6;
  string local_60;
  QPDFObjectHandle local_40;
  
  tVar1 = token->type;
  if (tVar1 != tt_eof) {
    if (tVar1 != tt_bad) {
      this->last_token_was_bad = false;
      if (tVar1 == tt_name) {
        ::qpdf::Name::normalize(&local_60,&token->value);
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)&local_60,__buf_01,in_RCX);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (tVar1 != tt_string) {
          if (tVar1 == tt_space) {
            uVar2 = (token->raw_value)._M_string_length;
            psVar6 = &token->raw_value;
            uVar5 = 0;
            lVar3 = std::__cxx11::string::find((char)psVar6,0xd);
            if (lVar3 != -1) {
              uVar5 = 0;
              do {
                if ((void *)(lVar3 - uVar5) != (void *)0x0) {
                  QPDFObjectHandle::TokenFilter::write
                            (&this->super_TokenFilter,(int)uVar5 + (int)(psVar6->_M_dataplus)._M_p,
                             (void *)(lVar3 - uVar5),in_RCX);
                }
                uVar5 = lVar3 + 1;
                if (uVar2 <= uVar5) {
                  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\n","");
                  QPDFObjectHandle::TokenFilter::write
                            (&this->super_TokenFilter,(int)&local_60,__buf_03,in_RCX);
                  goto LAB_0011ffd1;
                }
                if ((psVar6->_M_dataplus)._M_p[uVar5] != '\n') {
                  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\n","");
                  QPDFObjectHandle::TokenFilter::write
                            (&this->super_TokenFilter,(int)&local_60,__buf,in_RCX);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    local_60.field_2._M_allocated_capacity + 1);
                  }
                }
                lVar3 = std::__cxx11::string::find((char)psVar6,0xd);
              } while (lVar3 != -1);
            }
            if (uVar2 < uVar5 || (void *)(uVar2 - uVar5) == (void *)0x0) {
              return;
            }
            QPDFObjectHandle::TokenFilter::write
                      (&this->super_TokenFilter,(int)uVar5 + (int)(psVar6->_M_dataplus)._M_p,
                       (void *)(uVar2 - uVar5),in_RCX);
            return;
          }
          goto LAB_0011fdd7;
        }
        QPDFObjectHandle::newString(&local_40,&token->value);
        QPDFObjectHandle::unparse_abi_cxx11_(&local_60,&local_40);
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)&local_60,__buf_00,in_RCX);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      cVar4 = (char)token + '(';
      lVar3 = std::__cxx11::string::find(cVar4,0xd);
      if ((lVar3 == -1) && (lVar3 = std::__cxx11::string::find(cVar4,10), lVar3 == -1)) {
        return;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\n","");
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_60,__buf_02,in_RCX);
LAB_0011ffd1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    this->any_bad_tokens = true;
    this->last_token_was_bad = true;
  }
LAB_0011fdd7:
  QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
  return;
}

Assistant:

void
ContentNormalizer::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e token_type = token.getType();

    if (token_type == QPDFTokenizer::tt_bad) {
        this->any_bad_tokens = true;
        this->last_token_was_bad = true;
    } else if (token_type != QPDFTokenizer::tt_eof) {
        this->last_token_was_bad = false;
    }

    switch (token_type) {
    case QPDFTokenizer::tt_space:
        {
            std::string const& value = token.getRawValue();
            auto size = value.size();
            size_t pos = 0;
            auto r_pos = value.find('\r');
            while (r_pos != std::string::npos) {
                if (pos != r_pos) {
                    write(&value[pos], r_pos - pos);
                }
                if (++r_pos >= size) {
                    write("\n");
                    return;
                }
                if (value[r_pos] != '\n') {
                    write("\n");
                }
                pos = r_pos;
                r_pos = value.find('\r', pos);
            }
            if (pos < size) {
                write(&value[pos], size - pos);
            }
        }
        return;

    case QPDFTokenizer::tt_string:
        // Replacing string and name tokens in this way normalizes their representation as this will
        // automatically handle quoting of unprintable characters, etc.
        write(QPDFObjectHandle::newString(token.getValue()).unparse());
        break;

    case QPDFTokenizer::tt_name:
        write(Name::normalize(token.getValue()));
        break;

    default:
        writeToken(token);
        return;
    }

    // tt_string or tt_name
    std::string const& value = token.getRawValue();
    if (value.find('\r') != std::string::npos || value.find('\n') != std::string::npos) {
        write("\n");
    }
}